

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

void gotcha_assert_fail(char *s,char *file,uint line,char *function)

{
  int iVar1;
  uint uVar2;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  int result;
  char linestr [64];
  void *in_stack_ffffffffffffff68;
  char local_68 [72];
  char *local_20;
  char *local_10;
  char *local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = ulong_to_str((ulong)in_EDX,local_68,0x3f);
  if (iVar1 == -1) {
    local_68[0] = '\0';
  }
  gotcha_strlen(local_10);
  iVar1 = (int)((ulong)local_10 >> 0x20);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x106617);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x10662d);
  gotcha_strlen(local_68);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x106653);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x106669);
  gotcha_strlen(local_20);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x10668f);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x1066a5);
  gotcha_strlen(local_8);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x1066d1);
  gotcha_write(iVar1,in_stack_ffffffffffffff68,0x1066e7);
  uVar2 = gotcha_getpid();
  syscall(0x3e,(ulong)uVar2,6);
  return;
}

Assistant:

void gotcha_assert_fail(const char *s, const char *file, unsigned int line, const char *function)
{
   char linestr[64];
   int result;

   result = ulong_to_str(line, linestr, sizeof(linestr)-1);
   if (result == -1)
      linestr[0] = '\0';

   gotcha_write(2, file, gotcha_strlen(file));
   gotcha_write(2, ":", 1);
   gotcha_write(2, linestr, gotcha_strlen(linestr));
   gotcha_write(2, ": ", 2);
   gotcha_write(2, function, gotcha_strlen(function));
   gotcha_write(2, ": Assertion `", 13);
   gotcha_write(2, s, gotcha_strlen(s));
   gotcha_write(2, "' failed.\n", 10);
   syscall(SYS_kill, gotcha_getpid(), SIGABRT);
}